

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax,int startNodeIndex,
          int endNodeIndex)

{
  float fVar1;
  float fVar2;
  undefined2 uVar3;
  undefined2 uVar7;
  undefined2 uVar8;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined2 uVar9;
  int iVar10;
  float fVar11;
  bool bVar12;
  uint uVar13;
  float *pfVar14;
  int iVar15;
  btQuantizedBvhNode *pbVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar31;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar45;
  float fVar46;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 local_f8 [8];
  float afStack_f0 [2];
  undefined1 local_e8 [16];
  btVector3 *local_d8;
  btVector3 *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  float *local_a0;
  float *local_98;
  float *local_90;
  float *local_88;
  float *local_80;
  float *local_78;
  btNodeOverlapCallback *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar24 [16];
  undefined1 auVar22 [16];
  undefined1 auVar25 [16];
  short sVar28;
  short sVar29;
  undefined1 auVar43 [16];
  
  fVar52 = rayTarget->m_floats[2] - raySource->m_floats[2];
  pbVar16 = (this->m_quantizedContiguousNodes).m_data;
  local_c8 = (float)*(undefined8 *)rayTarget->m_floats - (float)*(undefined8 *)raySource->m_floats;
  fStack_c4 = (float)((ulong)*(undefined8 *)rayTarget->m_floats >> 0x20) -
              (float)((ulong)*(undefined8 *)raySource->m_floats >> 0x20);
  fStack_c0 = 0.0;
  fStack_bc = 0.0;
  fVar19 = fVar52 * fVar52 + local_c8 * local_c8 + fStack_c4 * fStack_c4;
  local_d8 = aabbMin;
  local_d0 = aabbMax;
  local_70 = nodeCallback;
  if (fVar19 < 0.0) {
    local_b8._0_4_ = fVar52;
    fStack_c0 = 0.0;
    fStack_bc = 0.0;
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
    local_b8._0_4_ = fVar52;
  }
  iVar15 = 0;
  if (startNodeIndex < endNodeIndex) {
    fVar19 = 1.0 / fVar19;
    local_b8._0_4_ = (float)local_b8._0_4_ * fVar19;
    auVar50._0_4_ = local_c8 * fVar19;
    auVar50._4_4_ = fStack_c4 * fVar19;
    auVar50._8_4_ = fStack_c0 * fVar19;
    auVar50._12_4_ = fStack_bc * fVar19;
    fVar19 = rayTarget->m_floats[0];
    fVar52 = raySource->m_floats[0];
    auVar36 = divps(_DAT_001f53f0,auVar50);
    fVar45 = (float)(~-(uint)(auVar50._8_4_ == 0.0) & auVar36._8_4_);
    fVar46 = (float)(~-(uint)(auVar50._12_4_ == 0.0) & auVar36._12_4_);
    fVar55 = (float)(-(uint)(auVar50._0_4_ == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(auVar50._0_4_ == 0.0) & auVar36._0_4_);
    fVar56 = (float)(-(uint)(auVar50._4_4_ == 0.0) & 0x5d5e0b6b |
                    ~-(uint)(auVar50._4_4_ == 0.0) & auVar36._4_4_);
    fVar35 = fVar19;
    if (fVar52 <= fVar19) {
      fVar35 = fVar52;
    }
    fVar40 = fVar19;
    if (fVar19 <= fVar52) {
      fVar40 = fVar52;
    }
    fVar35 = fVar35 + local_d8->m_floats[0];
    fVar40 = fVar40 + local_d0->m_floats[0];
    fVar57 = (float)(-(uint)((float)local_b8._0_4_ == 0.0) & 0x5d5e0b6b |
                    ~-(uint)((float)local_b8._0_4_ == 0.0) & (uint)(1.0 / (float)local_b8._0_4_));
    fVar1 = (this->m_bvhAabbMin).m_floats[0];
    fVar2 = (this->m_bvhAabbMax).m_floats[0];
    fVar47 = fVar1;
    if (fVar1 <= fVar40) {
      fVar47 = fVar40;
    }
    fVar40 = fVar2;
    if (fVar47 <= fVar2) {
      fVar40 = fVar47;
    }
    fVar47 = (this->m_bvhQuantization).m_floats[0];
    fVar11 = fVar1;
    if (fVar1 <= fVar35) {
      fVar11 = fVar35;
    }
    if (fVar11 <= fVar2) {
      fVar2 = fVar11;
    }
    uVar4 = *(ulong *)(rayTarget->m_floats + 1);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar4;
    uVar5 = *(ulong *)(raySource->m_floats + 1);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar5;
    fStack_64 = (float)(uVar4 >> 0x20) - (float)(uVar5 >> 0x20);
    local_68 = fStack_64 * (float)local_b8._0_4_ +
               (fVar19 - fVar52) * auVar50._0_4_ + auVar50._4_4_ * ((float)uVar4 - (float)uVar5);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar4;
    auVar36 = minps(auVar58,auVar41);
    auVar48._0_4_ = (float)*(undefined8 *)(local_d8->m_floats + 1) + auVar36._0_4_;
    auVar48._4_4_ = (float)((ulong)*(undefined8 *)(local_d8->m_floats + 1) >> 0x20) + auVar36._4_4_;
    auVar48._8_4_ = auVar36._8_4_ + 0.0;
    auVar48._12_4_ = auVar36._12_4_ + 0.0;
    uVar4 = *(ulong *)((this->m_bvhAabbMin).m_floats + 1);
    fVar19 = (float)(uVar4 >> 0x20);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = uVar4;
    auVar36 = maxps(auVar51,auVar48);
    uVar5 = *(ulong *)((this->m_bvhAabbMax).m_floats + 1);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar5;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar5;
    auVar36 = minps(auVar53,auVar36);
    uVar6 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 1);
    fVar52 = (float)uVar6;
    fVar35 = (float)((ulong)uVar6 >> 0x20);
    auVar54._0_4_ = (int)((auVar36._0_4_ - (float)uVar4) * fVar52);
    auVar54._4_4_ = (int)((auVar36._4_4_ - fVar19) * fVar35);
    auVar54._8_4_ = (int)((auVar36._8_4_ - 0.0) * 0.0);
    auVar54._12_4_ = (int)((auVar36._12_4_ - 0.0) * 0.0);
    auVar58 = pshuflw(auVar50,auVar54,0xe8);
    auVar36 = maxps(auVar37,auVar41);
    auVar38._0_4_ = auVar36._0_4_ + (float)*(undefined8 *)(local_d0->m_floats + 1);
    auVar38._4_4_ = auVar36._4_4_ + (float)((ulong)*(undefined8 *)(local_d0->m_floats + 1) >> 0x20);
    auVar38._8_4_ = auVar36._8_4_ + 0.0;
    auVar38._12_4_ = auVar36._12_4_ + 0.0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar4;
    auVar36 = maxps(auVar42,auVar38);
    auVar50 = minps(auVar49,auVar36);
    auVar36._0_4_ = (int)(fVar47 * (fVar40 - fVar1) + 1.0);
    auVar36._4_4_ = (int)(fVar52 * (auVar50._0_4_ - (float)uVar4) + 1.0);
    auVar36._8_4_ = (int)(fVar35 * (auVar50._4_4_ - fVar19) + 1.0);
    auVar36._12_4_ = (int)(fVar47 * (fVar2 - fVar1));
    auVar36 = pshuflw(auVar36,auVar36,0xe8);
    auVar36 = pshufhw(auVar36,auVar36,0xe8);
    auVar32._0_4_ = auVar36._0_4_;
    auVar32._8_4_ = auVar36._8_4_;
    auVar32._12_4_ = auVar36._12_4_;
    auVar32._4_4_ = auVar32._8_4_;
    auVar34._4_4_ = fVar56;
    auVar34._0_4_ = fVar56;
    auVar34._8_4_ = fVar56;
    auVar34._12_4_ = fVar56;
    pbVar16 = pbVar16 + startNodeIndex;
    local_78 = (float *)(local_f8 + (ulong)(fVar55 < 0.0) * 0x10);
    local_88 = (float *)(local_f8 + (ulong)(0.0 <= fVar55) * 0x10);
    local_90 = (float *)(local_f8 + (ulong)(fVar56 < 0.0) * 0x10 + 4);
    local_80 = (float *)(local_f8 + (ulong)(0.0 <= fVar56) * 0x10 + 4);
    local_a0 = (float *)(local_f8 + (ulong)(fVar57 < 0.0) * 0x10 + 8);
    pfVar14 = (float *)(local_f8 + (ulong)(0.0 <= fVar57) * 0x10 + 8);
    iVar15 = 0;
    local_b8 = auVar58 & _DAT_001f5d70 ^ _DAT_001f5db0;
    auVar36 = (~_DAT_001f59c0 & auVar32 & _DAT_001f5da0 | (_DAT_001f5d90 | auVar32) & _DAT_001f59c0)
              ^ _DAT_001f5db0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    auVar50 = _DAT_001f5db0;
    local_c8 = fVar55;
    fStack_c4 = fVar56;
    fStack_c0 = fVar45;
    fStack_bc = fVar46;
    local_98 = pfVar14;
    fStack_60 = fStack_64;
    fStack_5c = fStack_64;
    local_58 = auVar36;
    local_48 = fVar57;
    do {
      uVar3 = pbVar16->m_quantizedAabbMin[0];
      uVar7 = pbVar16->m_quantizedAabbMin[1];
      uVar8 = pbVar16->m_quantizedAabbMin[2];
      uVar9 = pbVar16->m_quantizedAabbMax[0];
      auVar21._6_2_ = uVar9;
      auVar21._4_2_ = uVar8;
      auVar21._2_2_ = uVar7;
      auVar21._0_2_ = uVar3;
      auVar21._8_8_ = 0;
      auVar21 = auVar21 ^ auVar50;
      sVar31 = -(ushort)(auVar21._6_2_ < auVar36._6_2_);
      sVar28 = -(ushort)(auVar36._4_2_ < auVar21._4_2_);
      sVar29 = -(ushort)(auVar36._6_2_ < auVar21._6_2_);
      auVar23._0_8_ =
           CONCAT26(sVar29,CONCAT24(sVar28,CONCAT22(-(ushort)(auVar36._2_2_ < auVar21._2_2_),
                                                    -(ushort)(auVar36._0_2_ < auVar21._0_2_))));
      auVar20._0_10_ = CONCAT28(-(ushort)(auVar36._8_2_ < auVar21._8_2_),auVar23._0_8_);
      auVar20._10_2_ = -(ushort)(auVar36._10_2_ < auVar21._10_2_);
      auVar22._12_2_ = -(ushort)(auVar36._12_2_ < auVar21._12_2_);
      auVar22._0_12_ = auVar20;
      auVar22._14_2_ = -(ushort)(auVar36._14_2_ < auVar21._14_2_);
      auVar32 = pshuflw(auVar34,auVar22,0x50);
      auVar25._12_2_ = sVar29;
      auVar25._0_12_ = auVar20;
      auVar25._14_2_ = sVar29;
      auVar24._12_4_ = auVar25._12_4_;
      auVar24._10_2_ = sVar28;
      auVar24._0_10_ = auVar20._0_10_;
      auVar23._10_6_ = auVar24._10_6_;
      auVar23._8_2_ = sVar28;
      auVar34._14_2_ = sVar31;
      auVar34._12_2_ = sVar31;
      auVar34._0_8_ = auVar32._0_8_;
      auVar34._8_4_ = (float)auVar23._8_4_;
      uVar13 = movmskps((int)pfVar14,auVar34);
      iVar10 = pbVar16->m_escapeIndexOrTriangleIndex;
      pfVar14 = (float *)(ulong)uVar13;
      bVar12 = false;
      if (uVar13 == 0) {
        auVar32 = ZEXT416(*(uint *)(pbVar16->m_quantizedAabbMax + 1)) ^ auVar50;
        auVar30._0_2_ = -(ushort)(auVar32._0_2_ < (short)local_b8._0_2_);
        auVar30._2_2_ = -(ushort)(auVar32._2_2_ < (short)local_b8._2_2_);
        auVar30._4_2_ = -(ushort)(auVar32._4_2_ < (short)local_b8._4_2_);
        auVar30._6_2_ = -(ushort)(auVar32._6_2_ < (short)local_b8._6_2_);
        auVar30._8_2_ = -(ushort)(auVar32._8_2_ < (short)local_b8._8_2_);
        auVar30._10_2_ = -(ushort)(auVar32._10_2_ < (short)local_b8._10_2_);
        auVar30._12_2_ = -(ushort)(auVar32._12_2_ < (short)local_b8._12_2_);
        auVar30._14_2_ = -(ushort)(auVar32._14_2_ < (short)local_b8._14_2_);
        auVar32 = pshuflw(auVar32,auVar30,0x50);
        auVar26._0_4_ = auVar32._0_4_;
        auVar26._4_4_ = auVar26._0_4_;
        auVar26._8_4_ = auVar32._4_4_;
        auVar26._12_4_ = auVar32._4_4_;
        uVar13 = movmskpd(0,auVar26);
        pfVar14 = (float *)(ulong)uVar13;
        bVar12 = false;
        if (((byte)((byte)uVar13 >> 1) == 0) && ((uVar13 & 1) == 0)) {
          fVar19 = (this->m_bvhQuantization).m_floats[2];
          auVar27._0_4_ = (float)(*(uint *)pbVar16->m_quantizedAabbMin & 0xffff);
          auVar27._4_4_ = (float)(*(uint *)pbVar16->m_quantizedAabbMin >> 0x10);
          auVar27._8_8_ = 0;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(this->m_bvhQuantization).m_floats;
          auVar32 = divps(auVar27,auVar39);
          uVar6 = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
          fVar35 = (float)uVar6;
          fVar40 = (float)((ulong)uVar6 >> 0x20);
          fVar52 = (this->m_bvhAabbMin).m_floats[2];
          auVar33._0_4_ = (float)(*(uint *)pbVar16->m_quantizedAabbMax & 0xffff);
          auVar33._4_4_ = (float)(*(uint *)pbVar16->m_quantizedAabbMax >> 0x10);
          auVar33._8_8_ = 0;
          auVar58 = divps(auVar33,auVar39);
          local_f8._4_4_ =
               (auVar32._4_4_ + fVar40) - (float)((ulong)*(undefined8 *)local_d0->m_floats >> 0x20);
          local_f8._0_4_ = (auVar32._0_4_ + fVar35) - (float)*(undefined8 *)local_d0->m_floats;
          afStack_f0[0] =
               ((float)pbVar16->m_quantizedAabbMin[2] / fVar19 + fVar52) - local_d0->m_floats[2];
          afStack_f0[1] = 0.0;
          local_e8._4_4_ =
               (auVar58._4_4_ + fVar40) - (float)((ulong)*(undefined8 *)local_d8->m_floats >> 0x20);
          local_e8._0_4_ = (auVar58._0_4_ + fVar35) - (float)*(undefined8 *)local_d8->m_floats;
          local_e8._8_4_ =
               ((float)pbVar16->m_quantizedAabbMax[2] / fVar19 + fVar52) - local_d8->m_floats[2];
          local_e8._12_4_ = 0;
          fVar19 = (float)*(undefined8 *)raySource->m_floats;
          fVar52 = (float)((ulong)*(undefined8 *)raySource->m_floats >> 0x20);
          auVar34._0_4_ = (*local_78 - fVar19) * fVar55;
          auVar34._4_4_ = (*local_80 - fVar52) * fVar56;
          auVar34._8_4_ = fVar45 * 0.0;
          auVar34._12_4_ = fVar46 * 0.0;
          bVar12 = false;
          pfVar14 = local_78;
          if (auVar34._0_4_ <= auVar34._4_4_) {
            fVar35 = (*local_88 - fVar19) * fVar55;
            fVar19 = (*local_90 - fVar52) * fVar56;
            pfVar14 = local_88;
            if (fVar19 <= fVar35) {
              iVar17 = -(uint)(auVar34._0_4_ < fVar19);
              iVar18 = -(uint)(auVar34._4_4_ < fVar35);
              auVar44._4_4_ = iVar18;
              auVar44._0_4_ = iVar17;
              auVar44._8_4_ = iVar18;
              auVar44._12_4_ = iVar18;
              auVar43._8_8_ = auVar44._8_8_;
              auVar43._4_4_ = iVar17;
              auVar43._0_4_ = iVar17;
              uVar13 = movmskpd((int)local_88,auVar43);
              if ((uVar13 & 1) == 0) {
                fVar19 = auVar34._0_4_;
              }
              fVar52 = auVar34._4_4_;
              if ((uVar13 & 2) == 0) {
                fVar52 = fVar35;
              }
              fVar35 = (*local_98 - raySource->m_floats[2]) * fVar57;
              auVar34 = ZEXT416((uint)fVar35);
              bVar12 = false;
              pfVar14 = local_98;
              if (fVar19 <= fVar35) {
                fVar40 = (*local_a0 - raySource->m_floats[2]) * fVar57;
                pfVar14 = local_a0;
                if (fVar40 <= fVar52) {
                  if (fVar40 <= fVar19) {
                    fVar40 = fVar19;
                  }
                  if (fVar52 <= fVar35) {
                    auVar34 = ZEXT416((uint)fVar52);
                  }
                  bVar12 = 0.0 < auVar34._0_4_ && fVar40 < local_68;
                }
              }
            }
          }
        }
      }
      if ((-1 < iVar10) && (bVar12)) {
        uVar13 = (*local_70->_vptr_btNodeOverlapCallback[2])
                           (local_70,(ulong)(uint)(pbVar16->m_escapeIndexOrTriangleIndex >> 0x15),
                            (ulong)(pbVar16->m_escapeIndexOrTriangleIndex & 0x1fffff));
        pfVar14 = (float *)(ulong)uVar13;
        auVar36 = local_58;
        auVar50 = _DAT_001f5db0;
        fVar55 = local_c8;
        fVar56 = fStack_c4;
        fVar45 = fStack_c0;
        fVar46 = fStack_bc;
        fVar57 = local_48;
      }
      pfVar14 = (float *)CONCAT71((int7)((ulong)pfVar14 >> 8),iVar10 < 0);
      if ((bool)(iVar10 < 0 & (bVar12 ^ 1U))) {
        iVar10 = pbVar16->m_escapeIndexOrTriangleIndex;
        startNodeIndex = startNodeIndex - iVar10;
        pfVar14 = (float *)((long)iVar10 * 0x10);
        pbVar16 = pbVar16 + -(long)iVar10;
      }
      else {
        pbVar16 = pbVar16 + 1;
        startNodeIndex = startNodeIndex + 1;
      }
      iVar15 = iVar15 + 1;
    } while (startNodeIndex < endNodeIndex);
  }
  if (maxIterations < iVar15) {
    maxIterations = iVar15;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessQuantizedTreeAgainstRay(btNodeOverlapCallback* nodeCallback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin, const btVector3& aabbMax, int startNodeIndex,int endNodeIndex) const
{
	btAssert(m_useQuantization);
	
	int curIndex = startNodeIndex;
	int walkIterations = 0;
	int subTreeSize = endNodeIndex - startNodeIndex;
	(void)subTreeSize;

	const btQuantizedBvhNode* rootNode = &m_quantizedContiguousNodes[startNodeIndex];
	int escapeIndex;
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned boxBoxOverlap = 0;
	unsigned rayBoxOverlap = 0;

	btScalar lambda_max = 1.0;

#ifdef RAYAABB2
	btVector3 rayDirection = (rayTarget-raySource);
	rayDirection.normalize ();
	lambda_max = rayDirection.dot(rayTarget-raySource);
	///what about division by zero? --> just set rayDirection[i] to 1.0
	rayDirection[0] = rayDirection[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[0];
	rayDirection[1] = rayDirection[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[1];
	rayDirection[2] = rayDirection[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDirection[2];
	unsigned int sign[3] = { rayDirection[0] < 0.0, rayDirection[1] < 0.0, rayDirection[2] < 0.0};
#endif

	/* Quick pruning by quantized box */
	btVector3 rayAabbMin = raySource;
	btVector3 rayAabbMax = raySource;
	rayAabbMin.setMin(rayTarget);
	rayAabbMax.setMax(rayTarget);

	/* Add box cast extents to bounding box */
	rayAabbMin += aabbMin;
	rayAabbMax += aabbMax;

	unsigned short int quantizedQueryAabbMin[3];
	unsigned short int quantizedQueryAabbMax[3];
	quantizeWithClamp(quantizedQueryAabbMin,rayAabbMin,0);
	quantizeWithClamp(quantizedQueryAabbMax,rayAabbMax,1);

	while (curIndex < endNodeIndex)
	{

//#define VISUALLY_ANALYZE_BVH 1
#ifdef VISUALLY_ANALYZE_BVH
		//some code snippet to debugDraw aabb, to visually analyze bvh structure
		static int drawPatch = 0;
		//need some global access to a debugDrawer
		extern btIDebugDraw* debugDrawerPtr;
		if (curIndex==drawPatch)
		{
			btVector3 aabbMin,aabbMax;
			aabbMin = unQuantize(rootNode->m_quantizedAabbMin);
			aabbMax = unQuantize(rootNode->m_quantizedAabbMax);
			btVector3	color(1,0,0);
			debugDrawerPtr->drawAabb(aabbMin,aabbMax,color);
		}
#endif//VISUALLY_ANALYZE_BVH

		//catch bugs in tree data
		btAssert (walkIterations < subTreeSize);

		walkIterations++;
		//PCK: unsigned instead of bool
		// only interested if this is closer than any previous hit
		btScalar param = 1.0;
		rayBoxOverlap = 0;
		boxBoxOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,rootNode->m_quantizedAabbMin,rootNode->m_quantizedAabbMax);
		isLeafNode = rootNode->isLeafNode();
		if (boxBoxOverlap)
		{
			btVector3 bounds[2];
			bounds[0] = unQuantize(rootNode->m_quantizedAabbMin);
			bounds[1] = unQuantize(rootNode->m_quantizedAabbMax);
			/* Add box cast extents */
			bounds[0] -= aabbMax;
			bounds[1] -= aabbMin;
			btVector3 normal;
#if 0
			bool ra2 = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0, lambda_max);
			bool ra = btRayAabb (raySource, rayTarget, bounds[0], bounds[1], param, normal);
			if (ra2 != ra)
			{
				printf("functions don't match\n");
			}
#endif
#ifdef RAYAABB2
			///careful with this check: need to check division by zero (above) and fix the unQuantize method
			///thanks Joerg/hiker for the reproduction case!
			///http://www.bulletphysics.com/Bullet/phpBB3/viewtopic.php?f=9&t=1858

			//BT_PROFILE("btRayAabb2");
			rayBoxOverlap = btRayAabb2 (raySource, rayDirection, sign, bounds, param, 0.0f, lambda_max);
			
#else
			rayBoxOverlap = true;//btRayAabb(raySource, rayTarget, bounds[0], bounds[1], param, normal);
#endif
		}
		
		if (isLeafNode && rayBoxOverlap)
		{
			nodeCallback->processNode(rootNode->getPartId(),rootNode->getTriangleIndex());
		}
		
		//PCK: unsigned instead of bool
		if ((rayBoxOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->getEscapeIndex();
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}